

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O0

void timeout_doall_arg(SSL_SESSION *session,void *void_param)

{
  TIMEOUT_PARAM *param;
  void *void_param_local;
  SSL_SESSION *session_local;
  
  if (((*(long *)((long)void_param + 8) == 0) ||
      (session->time + (ulong)session->timeout < session->time)) ||
     (session->time + (ulong)session->timeout < *(ulong *)((long)void_param + 8))) {
    lh_SSL_SESSION_delete(*(lhash_st_SSL_SESSION **)((long)void_param + 0x10),session);
    bssl::SSL_SESSION_list_remove(*void_param,session);
    if (*(long *)(*void_param + 0xa8) != 0) {
      (**(code **)(*void_param + 0xa8))(*void_param,session);
    }
    SSL_SESSION_free((SSL_SESSION *)session);
  }
  return;
}

Assistant:

static void timeout_doall_arg(SSL_SESSION *session, void *void_param) {
  TIMEOUT_PARAM *param = reinterpret_cast<TIMEOUT_PARAM *>(void_param);

  if (param->time == 0 ||                                  //
      session->time + session->timeout < session->time ||  //
      param->time > (session->time + session->timeout)) {
    // TODO(davidben): This can probably just call |remove_session|.
    (void)lh_SSL_SESSION_delete(param->cache, session);
    SSL_SESSION_list_remove(param->ctx, session);
    // TODO(https://crbug.com/boringssl/251): Callbacks should not be called
    // under a lock.
    if (param->ctx->remove_session_cb != NULL) {
      param->ctx->remove_session_cb(param->ctx, session);
    }
    SSL_SESSION_free(session);
  }
}